

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O0

int Sdb_StoDiffExactlyOne3(Vec_Wec_t *vCuts,int Limit,int *pCut,int *pCount)

{
  int iVar1;
  Vec_Int_t *p;
  int local_44;
  int local_40;
  int iNew;
  int k;
  int Count;
  int iNewAll;
  int i;
  Vec_Int_t *vCut;
  int *pCount_local;
  int *pCut_local;
  int Limit_local;
  Vec_Wec_t *vCuts_local;
  
  k = -1;
  iNew = 0;
  for (Count = 0; iVar1 = Vec_WecSize(vCuts), Count < iVar1; Count = Count + 1) {
    p = Vec_WecEntry(vCuts,Count);
    local_44 = -1;
    if (Count == Limit) break;
    for (local_40 = 1; local_40 <= *pCut; local_40 = local_40 + 1) {
      iVar1 = Vec_IntFind(p,pCut[local_40]);
      if (iVar1 < 0) {
        if (local_44 != -1) break;
        local_44 = pCut[local_40];
      }
    }
    if ((local_40 == *pCut + 1) && (local_44 != -1)) {
      if (k == -1) {
        k = local_44;
      }
      if (k == local_44) {
        iNew = iNew + 1;
      }
    }
  }
  *pCount = iNew;
  return k;
}

Assistant:

int Sdb_StoDiffExactlyOne3( Vec_Wec_t * vCuts, int Limit, int * pCut, int * pCount )
{
    Vec_Int_t * vCut;  
    int i, iNewAll = -1, Count = 0;
    Vec_WecForEachLevel( vCuts, vCut, i )
    {
        int k, iNew = -1;
        if ( i == Limit )
            break;
        for ( k = 1; k <= pCut[0]; k++ )
        {
            if ( Vec_IntFind(vCut, pCut[k]) >= 0 )
                continue;
            if ( iNew == -1 )
                iNew = pCut[k];
            else 
                break;
        }
        if ( k == pCut[0] + 1 && iNew != -1 )
        {
            if ( iNewAll == -1 )
                iNewAll = iNew;
            if ( iNewAll == iNew )
                Count++;
        }
    }
    *pCount = Count;
    return iNewAll;
}